

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O0

VkShaderModule demo_prepare_shader_module(demo *demo,void *code,size_t size)

{
  VkResult VVar1;
  VkShaderModule pVStack_50;
  VkResult err;
  VkShaderModule module;
  VkShaderModuleCreateInfo moduleCreateInfo;
  size_t size_local;
  void *code_local;
  demo *demo_local;
  
  module._0_4_ = 0x10;
  moduleCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  moduleCreateInfo._4_4_ = 0;
  moduleCreateInfo.pNext._0_4_ = 0;
  moduleCreateInfo._16_8_ = size;
  moduleCreateInfo.codeSize = (size_t)code;
  moduleCreateInfo.pCode = (uint32_t *)size;
  VVar1 = (*glad_vkCreateShaderModule)
                    (demo->device,(VkShaderModuleCreateInfo *)&module,(VkAllocationCallbacks *)0x0,
                     &stack0xffffffffffffffb0);
  if (VVar1 == VK_SUCCESS) {
    return pVStack_50;
  }
  __assert_fail("!err",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                ,0x4c4,
                "VkShaderModule demo_prepare_shader_module(struct demo *, const void *, size_t)");
}

Assistant:

static VkShaderModule
demo_prepare_shader_module(struct demo *demo, const void *code, size_t size) {
    VkShaderModuleCreateInfo moduleCreateInfo;
    VkShaderModule module;
    VkResult U_ASSERT_ONLY err;

    moduleCreateInfo.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
    moduleCreateInfo.pNext = NULL;

    moduleCreateInfo.codeSize = size;
    moduleCreateInfo.pCode = code;
    moduleCreateInfo.flags = 0;
    err = vkCreateShaderModule(demo->device, &moduleCreateInfo, NULL, &module);
    assert(!err);

    return module;
}